

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

index_t __thiscall xLearn::FromDMReader::Samples(FromDMReader *this,DMatrix **matrix)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  DMatrix *pDVar6;
  
  uVar1 = this->pos_;
  uVar4 = (ulong)uVar1;
  uVar3 = this->num_samples_;
  uVar5 = 0;
  do {
    if (uVar3 == uVar5) {
LAB_00129ee7:
      pDVar6 = &(this->super_Reader).data_samples_;
LAB_00129eeb:
      *matrix = pDVar6;
      return uVar3;
    }
    if ((ulong)this->data_ptr_->row_length <= uVar4 + uVar5) {
      if (uVar5 == 0) {
        if ((this->super_Reader).shuffle_ == true) {
          srand((this->super_Reader).seed_ + 1);
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(this->order_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(this->order_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
        }
        pDVar6 = (DMatrix *)0x0;
        uVar3 = 0;
        goto LAB_00129eeb;
      }
      goto LAB_00129ee7;
    }
    (this->super_Reader).data_samples_.row.
    super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar5] =
         (this->data_ptr_->row).
         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start
         [(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4 + uVar5]];
    pDVar6 = this->data_ptr_;
    uVar2 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4 + uVar5];
    (this->super_Reader).data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] =
         (pDVar6->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
    (this->super_Reader).data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar5] =
         (pDVar6->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
    this->pos_ = uVar1 + 1 + (int)uVar5;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

index_t FromDMReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= this->data_ptr_->row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = this->data_ptr_->row[order_[pos_]];
    data_samples_.Y[i] = this->data_ptr_->Y[order_[pos_]];
    data_samples_.norm[i] = this->data_ptr_->norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}